

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# to_interval.cpp
# Opt level: O0

interval_t duckdb::ToMilliSecondsOperator::Operation<double,duckdb::interval_t>(double input)

{
  interval_t iVar1;
  bool bVar2;
  double value;
  string *in_XMM0_Qa;
  interval_t result;
  int64_t in_stack_ffffffffffffff78;
  double in_stack_ffffffffffffff80;
  allocator *paVar3;
  allocator local_39;
  string local_38 [24];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffe0;
  undefined4 uVar4;
  undefined4 uVar5;
  int64_t local_8;
  
  uVar4 = 0;
  uVar5 = 0;
  bVar2 = TryMultiplyOperator::Operation<double,long,long>
                    (in_stack_ffffffffffffff80,in_stack_ffffffffffffff78,(int64_t *)0xcb5996);
  if (!bVar2) {
    value = (double)__cxa_allocate_exception(0x10);
    paVar3 = &local_39;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_38,"Interval value %s milliseconds out of range",paVar3);
    NumericHelper::ToString<double>(value);
    OutOfRangeException::OutOfRangeException<std::__cxx11::string>
              ((OutOfRangeException *)CONCAT44(uVar5,uVar4),in_XMM0_Qa,in_stack_ffffffffffffffe0);
    __cxa_throw(value,&OutOfRangeException::typeinfo,OutOfRangeException::~OutOfRangeException);
  }
  iVar1.days = uVar5;
  iVar1.months = uVar4;
  iVar1.micros = local_8;
  return iVar1;
}

Assistant:

static inline TR Operation(TA input) {
		interval_t result;
		result.months = 0;
		result.days = 0;
		if (!TryMultiplyOperator::Operation<TA, int64_t, int64_t>(input, Interval::MICROS_PER_MSEC, result.micros)) {
			throw OutOfRangeException("Interval value %s milliseconds out of range", NumericHelper::ToString(input));
		}
		return result;
	}